

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
read_internal(basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
             error_code *ec)

{
  char *pcVar1;
  span<const_char,_18446744073709551615UL> sVar2;
  
  do {
    if ((this->parser_).more_ != true) {
      return;
    }
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      sVar2 = text_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar1 = sVar2.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar2.size_ != 0) {
        (this->parser_).begin_input_ = pcVar1;
        (this->parser_).input_end_ = pcVar1 + sVar2.size_;
        (this->parser_).input_ptr_ = pcVar1;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,this->visitor_,ec);
  } while (ec->_M_value == 0);
  return;
}

Assistant:

void read_internal(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = csv_errc::source_error;
                return;
            }   
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
        }